

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this)

{
  size_t __n;
  int iVar1;
  LinkClosure *pLVar2;
  pointer lang;
  
  pLVar2 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  lang = (pLVar2->Languages).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (lang != (pLVar2->Languages).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      __n = lang->_M_string_length;
      if ((__n != (this->LinkLanguage)._M_string_length) ||
         ((__n != 0 &&
          (iVar1 = bcmp((lang->_M_dataplus)._M_p,(this->LinkLanguage)._M_dataplus._M_p,__n),
          iVar1 != 0)))) {
        AddImplicitLinkInfo(this,lang);
      }
      lang = lang + 1;
    } while (lang != (pLVar2->Languages).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo()
{
  // The link closure lists all languages whose implicit info is needed.
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for (std::vector<std::string>::const_iterator li = lc->Languages.begin();
       li != lc->Languages.end(); ++li) {
    // Skip those of the linker language.  They are implicit.
    if (*li != this->LinkLanguage) {
      this->AddImplicitLinkInfo(*li);
    }
  }
}